

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

Boxed_Value
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::buildFloat(string_view t_val)

{
  byte bVar1;
  bool bVar2;
  char *in_RDX;
  chaiscript *pcVar4;
  element_type *this;
  chaiscript *this_00;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  type_conflict2 tVar8;
  type_conflict1 tVar9;
  string_view t_str;
  string_view t_str_00;
  string_view t_str_01;
  Boxed_Value BVar10;
  type_conflict1 local_18 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  pcVar4 = (chaiscript *)t_val._M_str;
  this = (element_type *)t_val._M_len;
  if (pcVar4 == (chaiscript *)0x0) {
    this_00 = (chaiscript *)0x0;
  }
  else {
    bVar2 = false;
    this_00 = pcVar4;
    bVar5 = 0;
    do {
      bVar1 = bVar5;
      bVar5 = (in_RDX + -1)[(long)this_00] & 0xdf;
      bVar7 = bVar5 == 0x46;
      if (!bVar7) {
        bVar2 = (bool)(bVar5 == 0x4c | bVar2);
      }
      uVar6 = (byte)(in_RDX + -1)[(long)this_00] - 0x46;
      if ((0x26 < uVar6) || ((0x4100000041U >> ((ulong)uVar6 & 0x3f) & 1) == 0)) goto LAB_0033b275;
      this_00 = this_00 + -1;
      bVar5 = bVar7 | bVar1;
    } while (this_00 != (chaiscript *)0x0);
    this_00 = (chaiscript *)0x0;
LAB_0033b275:
    if ((bool)(bVar7 | bVar1)) {
      if (pcVar4 < this_00) {
        this_00 = pcVar4;
      }
      t_str._M_str = in_RDX;
      t_str._M_len = (size_t)in_RDX;
      tVar8 = parse_num<float>(this_00,t_str);
      local_18[0]._0_4_ = tVar8;
      BVar10 = detail::const_var_impl<float>((detail *)this,(float *)local_18);
      _Var3._M_pi = BVar10.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_0033b2e0;
    }
    if (bVar2) {
      if (pcVar4 < this_00) {
        this_00 = pcVar4;
      }
      t_str_00._M_str = in_RDX;
      t_str_00._M_len = (size_t)in_RDX;
      parse_num<long_double>((type_conflict3 *)this_00,t_str_00);
      BVar10 = detail::const_var_impl<long_double>((detail *)this,(longdouble *)local_18);
      _Var3._M_pi = BVar10.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      goto LAB_0033b2e0;
    }
  }
  if (pcVar4 < this_00) {
    this_00 = pcVar4;
  }
  t_str_01._M_str = in_RDX;
  t_str_01._M_len = (size_t)in_RDX;
  tVar9 = parse_num<double>(this_00,t_str_01);
  local_18[0] = tVar9;
  BVar10 = detail::const_var_impl<double>((detail *)this,local_18);
  _Var3._M_pi = BVar10.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
LAB_0033b2e0:
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = this;
  return (Boxed_Value)
         BVar10.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildFloat(std::string_view t_val) {
        bool float_ = false;
        bool long_ = false;

        auto i = t_val.size();

        for (; i > 0; --i) {
          char val = t_val[i - 1];

          if (val == 'f' || val == 'F') {
            float_ = true;
          } else if (val == 'l' || val == 'L') {
            long_ = true;
          } else {
            break;
          }
        }

        if (float_) {
          return const_var(parse_num<float>(t_val.substr(0, i)));
        } else if (long_) {
          return const_var(parse_num<long double>(t_val.substr(0, i)));
        } else {
          return const_var(parse_num<double>(t_val.substr(0, i)));
        }
      }